

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O1

bool __thiscall Sector::operator==(Sector *this,Sector *sector)

{
  pointer pDVar1;
  void *__s1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  bVar2 = Header::operator!=(&sector->header,&this->header);
  if (!bVar2) {
    pDVar1 = (sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
         super__Vector_impl_data._M_finish == pDVar1) &&
       ((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_start)) {
LAB_0016bca4:
      uVar4 = 1;
      goto LAB_0016bc6a;
    }
    iVar3 = (int)((long)(sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pDVar1 >> 3) * -0x55555555;
    if ((iVar3 != 0) &&
       (iVar5 = 0,
       (int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0)) {
      if (iVar3 != 0) {
        iVar5 = *(int *)&(pDVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(pDVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      }
      iVar3 = Header::sector_size(&sector->header);
      uVar4 = 0;
      if (iVar5 < iVar3) goto LAB_0016bc6a;
      pDVar1 = (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl
                              .super__Vector_impl_data._M_finish - (long)pDVar1) >> 3) * -0x55555555
          != 0) {
        uVar4 = *(int *)((long)&(pDVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl + 8) -
                *(int *)&(pDVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
      }
      iVar3 = Header::sector_size(&this->header);
      if (iVar3 <= (int)uVar4) {
        __s1 = *(void **)&(((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                            super__Vector_impl_data._M_start)->
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
        iVar3 = Header::sector_size(&this->header);
        if (iVar3 != 0) {
          iVar3 = bcmp(__s1,*(void **)&(((sector->m_data).
                                         super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                                         super__Vector_impl_data._M_start)->
                                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl,(long)iVar3);
          uVar4 = (uint)(iVar3 == 0);
          goto LAB_0016bc6a;
        }
        goto LAB_0016bca4;
      }
    }
  }
  uVar4 = 0;
LAB_0016bc6a:
  return SUB41(uVar4,0);
}

Assistant:

bool Sector::operator== (const Sector& sector) const
{
    // Headers must match
    if (sector.header != header)
        return false;

    // If neither has data it's a match
    if (sector.m_data.size() == 0 && m_data.size() == 0)
        return true;

    // Both sectors must have some data
    if (sector.copies() == 0 || copies() == 0)
        return false;

    // Both first sectors must have at least the natural size to compare
    if (sector.data_size() < sector.size() || data_size() < size())
        return false;

    // The natural data contents must match
    return std::equal(data_copy().begin(), data_copy().begin() + size(), sector.data_copy().begin());
}